

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

bnode * dummy_node(uint8_t ksize,uint8_t vsize,uint16_t level)

{
  bnode *__s;
  uint16_t in_DX;
  undefined1 in_SIL;
  undefined1 in_DIL;
  bnode *node;
  undefined2 local_2;
  
  local_2 = CONCAT11(in_DIL,in_SIL);
  __s = (bnode *)malloc(0x1010);
  memset(__s,0,0x10);
  __s->kvsize = local_2;
  __s->level = in_DX;
  (__s->field_4).data = __s + 1;
  return __s;
}

Assistant:

struct bnode* dummy_node(uint8_t ksize, uint8_t vsize, uint16_t level)
{
    struct bnode *node;
    node = (struct bnode*)malloc(sizeof(bnode) + FDB_BLOCKSIZE);
    memset(node, 0, sizeof(bnode));

    node->kvsize = ksize<<8 | vsize;
    node->level = level;
    node->data = (uint8_t *)node + sizeof(bnode);
    return node;
}